

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char sqlite3ExprAffinity(Expr *pExpr)

{
  short sVar1;
  ExprList *pEVar2;
  byte bVar3;
  char cVar4;
  
  do {
    for (; (pExpr->flags & 0x42000) != 0; pExpr = pExpr->pLeft) {
    }
    bVar3 = pExpr->op;
    if (bVar3 == 0xb0) {
      bVar3 = pExpr->op2;
    }
    if (bVar3 < 0xa9) {
      if (bVar3 != 0x8a) {
        if (bVar3 == 0x24) {
          cVar4 = sqlite3AffinityType((pExpr->u).zToken,(Column *)0x0);
          return cVar4;
        }
        if (bVar3 != 0xa7) goto LAB_001898eb;
        goto LAB_001898c1;
      }
      pEVar2 = ((pExpr->x).pSelect)->pEList;
    }
    else if (bVar3 == 0xb1) {
      pEVar2 = (pExpr->x).pList;
    }
    else {
      if (bVar3 != 0xb2) {
        if (bVar3 != 0xa9) {
LAB_001898eb:
          return pExpr->affExpr;
        }
LAB_001898c1:
        sVar1 = pExpr->iColumn;
        cVar4 = 'D';
        if ((-1 < (long)sVar1) && (sVar1 < ((pExpr->y).pTab)->nCol)) {
          cVar4 = ((pExpr->y).pTab)->aCol[sVar1].affinity;
        }
        return cVar4;
      }
      pEVar2 = (ExprList *)&((pExpr->pLeft->x).pSelect)->pEList->a[(long)pExpr->iColumn + -1].fg;
    }
    pExpr = pEVar2->a[0].pExpr;
  } while( true );
}

Assistant:

SQLITE_PRIVATE char sqlite3ExprAffinity(const Expr *pExpr){
  int op;
  while( ExprHasProperty(pExpr, EP_Skip|EP_IfNullRow) ){
    assert( pExpr->op==TK_COLLATE
         || pExpr->op==TK_IF_NULL_ROW
         || (pExpr->op==TK_REGISTER && pExpr->op2==TK_IF_NULL_ROW) );
    pExpr = pExpr->pLeft;
    assert( pExpr!=0 );
  }
  op = pExpr->op;
  if( op==TK_REGISTER ) op = pExpr->op2;
  if( op==TK_COLUMN || op==TK_AGG_COLUMN ){
    assert( ExprUseYTab(pExpr) );
    assert( pExpr->y.pTab!=0 );
    return sqlite3TableColumnAffinity(pExpr->y.pTab, pExpr->iColumn);
  }
  if( op==TK_SELECT ){
    assert( ExprUseXSelect(pExpr) );
    assert( pExpr->x.pSelect!=0 );
    assert( pExpr->x.pSelect->pEList!=0 );
    assert( pExpr->x.pSelect->pEList->a[0].pExpr!=0 );
    return sqlite3ExprAffinity(pExpr->x.pSelect->pEList->a[0].pExpr);
  }
#ifndef SQLITE_OMIT_CAST
  if( op==TK_CAST ){
    assert( !ExprHasProperty(pExpr, EP_IntValue) );
    return sqlite3AffinityType(pExpr->u.zToken, 0);
  }
#endif
  if( op==TK_SELECT_COLUMN ){
    assert( pExpr->pLeft!=0 && ExprUseXSelect(pExpr->pLeft) );
    assert( pExpr->iColumn < pExpr->iTable );
    assert( pExpr->iTable==pExpr->pLeft->x.pSelect->pEList->nExpr );
    return sqlite3ExprAffinity(
        pExpr->pLeft->x.pSelect->pEList->a[pExpr->iColumn].pExpr
    );
  }
  if( op==TK_VECTOR ){
    assert( ExprUseXList(pExpr) );
    return sqlite3ExprAffinity(pExpr->x.pList->a[0].pExpr);
  }
  return pExpr->affExpr;
}